

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

cmDependInformation * __thiscall
anon_unknown.dwarf_5dc644::cmLBDepend::GetDependInformation
          (cmLBDepend *this,string *file,string *extraPath)

{
  cmDependInformation *__rhs;
  _Rb_tree_header *__x;
  size_t *psVar1;
  pointer pbVar2;
  default_delete<(anonymous_namespace)::cmDependInformation> *this_00;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _Rb_tree_header *p_Var7;
  bool bVar8;
  iterator iVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  iterator iVar13;
  _Head_base<0UL,_(anonymous_namespace)::cmDependInformation_*,_false> __s;
  cmDependInformation *this_01;
  ulong uVar14;
  _Rb_tree_node_base *p_Var15;
  _Head_base<0UL,_(anonymous_namespace)::cmDependInformation_*,_false> _Var16;
  _Alloc_hider in_RCX;
  _Base_ptr p_Var17;
  pointer pbVar18;
  cmDependInformation *__ptr;
  DirectoryToFileToPathMapType *this_02;
  _Base_ptr *__rhs_00;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar19;
  string fullPath;
  string path;
  __single_object info;
  
  this_02 = &this->DirectoryToFileToPathMap;
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::find(&this_02->_M_t,extraPath);
  if (((_Rb_tree_header *)iVar9._M_node ==
       &(this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header) ||
     (iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(iVar9._M_node + 2,file),
     iVar10._M_node == (_Base_ptr)&iVar9._M_node[2]._M_parent)) {
    bVar8 = cmsys::SystemTools::FileExists(file,true);
    if (!bVar8) {
      pbVar2 = (this->IncludeDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar18 = (this->IncludeDirectories).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar2;
          pbVar18 = pbVar18 + 1) {
        std::__cxx11::string::string((string *)&path,(string *)pbVar18);
        if ((path._M_string_length != 0) &&
           (in_RCX = path._M_dataplus, path._M_dataplus._M_p[path._M_string_length - 1] != '/')) {
          std::__cxx11::string::append((char *)&path);
        }
        std::__cxx11::string::append((string *)&path);
        bVar8 = cmsys::SystemTools::FileExists(&path,true);
        if ((bVar8) && (bVar8 = cmsys::SystemTools::FileIsDirectory(&path), !bVar8)) {
          cmsys::SystemTools::CollapseFullPath(&fullPath,&path);
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ::operator[](this_02,extraPath);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](pmVar11,file);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          goto LAB_001f429a;
        }
        std::__cxx11::string::~string((string *)&path);
      }
      if (extraPath->_M_string_length != 0) {
        std::__cxx11::string::string((string *)&path,(string *)extraPath);
        if ((path._M_string_length != 0) &&
           (in_RCX = path._M_dataplus, path._M_dataplus._M_p[path._M_string_length - 1] != '/')) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                         &path,"/");
          std::__cxx11::string::operator=((string *)&path,(string *)&info);
          std::__cxx11::string::~string((string *)&info);
          in_RCX._M_p = path._M_dataplus._M_p;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                       &path,file);
        std::__cxx11::string::operator=((string *)&path,(string *)&info);
        std::__cxx11::string::~string((string *)&info);
        bVar8 = cmsys::SystemTools::FileExists(&path,true);
        if ((bVar8) && (bVar8 = cmsys::SystemTools::FileIsDirectory(&path), !bVar8)) {
          cmsys::SystemTools::CollapseFullPath(&fullPath,&path);
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ::operator[](this_02,extraPath);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](pmVar11,file);
          std::__cxx11::string::_M_assign((string *)pmVar12);
LAB_001f429a:
          std::__cxx11::string::~string((string *)&path);
          goto LAB_001f3fcd;
        }
        std::__cxx11::string::~string((string *)&path);
      }
      goto LAB_001f3fc8;
    }
    cmsys::SystemTools::CollapseFullPath(&fullPath,file);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              ::operator[](this_02,extraPath);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pmVar11,file);
    std::__cxx11::string::_M_assign((string *)pmVar12);
  }
  else {
    file = (string *)(iVar10._M_node + 2);
LAB_001f3fc8:
    std::__cxx11::string::string((string *)&fullPath,(string *)file);
  }
LAB_001f3fcd:
  __x = &(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header;
  iVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                             *)(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&fullPath,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX._M_p);
  if (((_Rb_tree_header *)iVar13._M_node != __x) &&
     (bVar8 = std::operator<(&fullPath,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (iVar13._M_node + 1)), !bVar8)) {
    __s._M_head_impl = *(cmDependInformation **)(iVar13._M_node + 2);
    goto LAB_001f4331;
  }
  __s._M_head_impl = (cmDependInformation *)operator_new(0xa0);
  p_Var7 = &((__s._M_head_impl)->DependencySet)._M_t._M_impl.super__Rb_tree_header;
  memset(__s._M_head_impl,0,0xa0);
  *(_Rb_tree_header **)
   ((long)&((__s._M_head_impl)->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x10) = p_Var7;
  *(_Rb_tree_header **)
   ((long)&((__s._M_head_impl)->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x18) = p_Var7;
  ((__s._M_head_impl)->FullPath)._M_dataplus._M_p = (pointer)&((__s._M_head_impl)->FullPath).field_2
  ;
  ((__s._M_head_impl)->PathOnly)._M_dataplus._M_p = (pointer)&((__s._M_head_impl)->PathOnly).field_2
  ;
  ((__s._M_head_impl)->IncludeName)._M_dataplus._M_p =
       (pointer)&((__s._M_head_impl)->IncludeName).field_2;
  info._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::cmDependInformation_*,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
  .super__Head_base<0UL,_(anonymous_namespace)::cmDependInformation_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>,_true,_true>
        )(__uniq_ptr_data<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>,_true,_true>
          )__s._M_head_impl;
  std::__cxx11::string::_M_assign((string *)&(__s._M_head_impl)->FullPath);
  cmsys::SystemTools::GetFilenamePath(&path,&fullPath);
  std::__cxx11::string::operator=((string *)&(__s._M_head_impl)->PathOnly,(string *)&path);
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::_M_assign((string *)&(__s._M_head_impl)->IncludeName);
  iVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                             *)(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&fullPath,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX._M_p);
  pVar3.second = iVar13._M_node;
  pVar3.first = iVar13._M_node;
  _Var16._M_head_impl = __s._M_head_impl;
  if ((_Rb_tree_header *)iVar13._M_node == __x) {
LAB_001f40d5:
    this_01 = (cmDependInformation *)operator_new(0x48);
    __rhs_00 = &(this_01->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    std::__cxx11::string::string((string *)__rhs_00,(string *)&fullPath);
    (this_01->FullPath)._M_dataplus._M_p = (pointer)0x0;
    if ((_Rb_tree_header *)iVar13._M_node == __x) {
      if (((this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
         (__ptr = (cmDependInformation *)__rhs_00,
         bVar8 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_right + 1),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs_00), !bVar8)) {
LAB_001f42b1:
        __ptr = (cmDependInformation *)__rhs_00;
        pVar19 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                 ::_M_get_insert_unique_pos(&(this->DependInformationMap)._M_t,(key_type *)__rhs_00)
        ;
      }
      else {
        p_Var17 = (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
        ;
LAB_001f4259:
        auVar6._8_8_ = 0;
        auVar6._0_8_ = p_Var17;
        pVar19 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar6 << 0x40);
      }
LAB_001f42b9:
      iVar13._M_node = pVar19.first;
      if (pVar19.second == (_Rb_tree_node_base *)0x0) {
LAB_001f4301:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
        ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                        *)this_01,(_Link_type)__ptr);
        goto LAB_001f430f;
      }
    }
    else {
      __rhs = (cmDependInformation *)(iVar13._M_node + 1);
      __ptr = __rhs;
      bVar8 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__rhs);
      if (!bVar8) {
        __ptr = (cmDependInformation *)__rhs_00;
        bVar8 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs_00);
        if (bVar8) {
          p_Var17 = (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_right;
          if (p_Var17 == iVar13._M_node) goto LAB_001f4259;
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar13._M_node);
          pVar19.second = p_Var15;
          pVar19.first = p_Var15;
          __ptr = (cmDependInformation *)(p_Var15 + 1);
          bVar8 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__rhs_00,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__ptr);
          if (!bVar8) goto LAB_001f42b1;
          if ((iVar13._M_node)->_M_right == (_Base_ptr)0x0) {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = iVar13._M_node;
            pVar19 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar5 << 0x40);
            goto LAB_001f42c4;
          }
          goto LAB_001f42b9;
        }
        goto LAB_001f4301;
      }
      p_Var17 = (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pVar19.second = p_Var17;
      pVar19.first = p_Var17;
      if (p_Var17 == iVar13._M_node) goto LAB_001f42b9;
      uVar14 = std::_Rb_tree_decrement(iVar13._M_node);
      __ptr = (cmDependInformation *)__rhs_00;
      bVar8 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (uVar14 + 0x20),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs_00);
      if (!bVar8) goto LAB_001f42b1;
      pVar19 = pVar3;
      if (*(long *)(uVar14 + 0x18) != 0) goto LAB_001f42b9;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar14;
      pVar19 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar4 << 0x40);
    }
LAB_001f42c4:
    p_Var15 = pVar19.second;
    bVar8 = true;
    if ((__x != (_Rb_tree_header *)p_Var15) && (pVar19.first == (_Rb_tree_node_base *)0x0)) {
      bVar8 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(p_Var15 + 1));
    }
    __ptr = this_01;
    std::_Rb_tree_insert_and_rebalance(bVar8,(_Rb_tree_node_base *)this_01,p_Var15,&__x->_M_header);
    psVar1 = &(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar1 = *psVar1 + 1;
    _Var16._M_head_impl = (cmDependInformation *)info;
    iVar13._M_node = (_Base_ptr)this_01;
  }
  else {
    __ptr = (cmDependInformation *)(iVar13._M_node + 1);
    bVar8 = std::operator<(&fullPath,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __ptr);
    if (bVar8) goto LAB_001f40d5;
  }
LAB_001f430f:
  info._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::cmDependInformation_*,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
  .super__Head_base<0UL,_(anonymous_namespace)::cmDependInformation_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>,_true,_true>
        )(__uniq_ptr_impl<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
          )0x0;
  this_00 = (default_delete<(anonymous_namespace)::cmDependInformation> *)
            (((cmDependInformation *)iVar13._M_node)->FullPath)._M_dataplus._M_p;
  (((cmDependInformation *)iVar13._M_node)->FullPath)._M_dataplus._M_p =
       (pointer)_Var16._M_head_impl;
  if (this_00 != (default_delete<(anonymous_namespace)::cmDependInformation> *)0x0) {
    std::default_delete<(anonymous_namespace)::cmDependInformation>::operator()(this_00,__ptr);
  }
  std::
  unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
  ::~unique_ptr(&info);
LAB_001f4331:
  std::__cxx11::string::~string((string *)&fullPath);
  return (cmDependInformation *)
         (_Tuple_impl<0UL,_(anonymous_namespace)::cmDependInformation_*,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>
          )__s._M_head_impl;
}

Assistant:

cmDependInformation* GetDependInformation(const std::string& file,
                                            const std::string& extraPath)
  {
    // Get the full path for the file so that lookup is unambiguous.
    std::string fullPath = this->FullPath(file, extraPath);

    // Try to find the file's instance of cmDependInformation.
    auto result = this->DependInformationMap.find(fullPath);
    if (result != this->DependInformationMap.end()) {
      // Found an instance, return it.
      return result->second.get();
    }
    // Didn't find an instance.  Create a new one and save it.
    auto info = cm::make_unique<cmDependInformation>();
    auto* ptr = info.get();
    info->FullPath = fullPath;
    info->PathOnly = cmSystemTools::GetFilenamePath(fullPath);
    info->IncludeName = file;
    this->DependInformationMap[fullPath] = std::move(info);
    return ptr;
  }